

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

void __thiscall slang::SVInt::setAllZeros(SVInt *this)

{
  bool bVar1;
  uint bits;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_20;
  uint local_18;
  byte local_13;
  
  bits = (this->super_SVIntStorage).bitWidth;
  bVar1 = (this->super_SVIntStorage).unknownFlag;
  if (bits < 0x41 && (bVar1 & 1U) == 0) {
    (this->super_SVIntStorage).field_0.val = 0;
  }
  else {
    if ((bVar1 & 1U) == 0) {
      memset((this->super_SVIntStorage).field_0.pVal,0,
             (ulong)(((bits + 0x3f >> 6) << (bVar1 & 0x1fU)) << 3));
      return;
    }
    SVInt((SVInt *)&local_20,bits,0,(this->super_SVIntStorage).signFlag);
    operator=(this,(SVInt *)&local_20);
    if (((0x40 < local_18) || ((local_13 & 1) != 0)) && ((void *)local_20.val != (void *)0x0)) {
      operator_delete__(local_20.pVal);
    }
  }
  return;
}

Assistant:

void SVInt::setAllZeros() {
    if (isSingleWord())
        val = 0;
    else if (unknownFlag)
        *this = SVInt(bitWidth, 0, signFlag);
    else
        memset(pVal, 0, getNumWords() * WORD_SIZE);
}